

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O3

int complt(int flags,int c,char *buf,size_t nbuf,int cpos,int *nx)

{
  long lVar1;
  char cVar2;
  char *__s2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  buffer *pbVar9;
  long lVar10;
  buffer *pbVar11;
  ulong __n;
  ulong uVar12;
  int iVar13;
  int iVar14;
  char *__s;
  int iVar15;
  bool bVar16;
  buffer *local_48;
  int local_40;
  int local_34;
  
  __n = (ulong)cpos;
  if ((flags & 1U) == 0) {
    if ((flags & 2U) == 0) {
      if ((flags & 4U) == 0) {
        panic("broken complt call: flags");
      }
      buf[__n] = '\0';
      pbVar9 = (buffer *)make_file_list(buf);
      local_48 = pbVar9;
    }
    else {
      local_48 = (buffer *)0x0;
      pbVar9 = bheadp;
    }
  }
  else {
    buf[__n] = '\0';
    pbVar9 = (buffer *)complete_function_list(buf);
    local_48 = pbVar9;
  }
  if ((c & 0xfffffffbU) != 9) {
    panic("broken complt call: c");
  }
  __s = " [No match]";
  if (pbVar9 == (buffer *)0x0) {
    local_34 = 1000;
LAB_0010d8d5:
    local_40 = 0;
  }
  else {
    uVar12 = __n + 1;
    local_34 = 1000;
    iVar15 = 0;
    pbVar11 = (buffer *)0x0;
    do {
      __s2 = (pbVar9->b_list).l_name;
      iVar7 = bcmp(buf,__s2,__n);
      iVar6 = local_34;
      if (iVar7 == 0) {
        if (iVar15 == 0) {
          pbVar11 = pbVar9;
        }
        iVar15 = iVar15 + 1;
        if (__s2[__n] == '\0') {
          local_34 = -1;
          iVar6 = local_34;
        }
        else {
          pcVar3 = (pbVar11->b_list).l_name;
          iVar7 = cpos;
          if (__s2[__n] == pcVar3[__n]) {
            lVar10 = 0;
            do {
              lVar5 = lVar10 + uVar12;
              lVar1 = lVar10 + 1;
              if (__s2[lVar5] == '\0') break;
              lVar4 = lVar10 + uVar12;
              lVar10 = lVar1;
            } while (__s2[lVar5] == pcVar3[lVar4]);
            iVar7 = (int)lVar1 + cpos;
          }
          pbVar11 = pbVar9;
          iVar6 = iVar7 - cpos;
          if (local_34 <= iVar7 - cpos) {
            iVar6 = local_34;
          }
        }
      }
      local_34 = iVar6;
      pbVar9 = (buffer *)(pbVar9->b_list).l_p.l_wp;
    } while (pbVar9 != (buffer *)0x0);
    if (iVar15 == 0) goto LAB_0010d8d5;
    if ((iVar15 < 2) || (local_34 != 0)) {
      if (__n < nbuf && 0 < local_34) {
        iVar15 = 1;
        do {
          cVar2 = (pbVar11->b_list).l_name[uVar12 - 1];
          buf[uVar12 - 1] = cVar2;
          eputc(cVar2);
          if (local_34 <= iVar15) break;
          iVar15 = iVar15 + 1;
          bVar16 = uVar12 < nbuf;
          uVar12 = uVar12 + 1;
        } while (bVar16);
      }
      ttflush();
      free_file_list(&local_48->b_list);
      iVar15 = 0;
      if (0 < local_34) {
        iVar15 = local_34;
      }
      if (c != 0xd) {
        local_34 = iVar15;
      }
      local_40 = 1;
      goto LAB_0010d9dc;
    }
    local_34 = 0;
    __s = " [Ambiguous. Ctrl-G to cancel]";
    local_40 = 1;
  }
  free_file_list(&local_48->b_list);
  sVar8 = strlen(__s);
  iVar6 = ncol;
  iVar15 = ttcol;
  iVar13 = (int)sVar8 + ttcol + 2;
  iVar7 = (ncol - ttcol) + -2;
  if (iVar13 <= ncol) {
    iVar7 = (int)sVar8;
  }
  cVar2 = *__s;
  while (cVar2 != '\0') {
    __s = __s + 1;
    eputc(cVar2);
    cVar2 = *__s;
  }
  ttcol = ttcol - iVar7;
  if (iVar7 == 0) {
    ttflush();
  }
  else {
    iVar14 = iVar13;
    if (iVar6 < iVar13) {
      iVar14 = iVar6;
    }
    iVar14 = (iVar15 - iVar14) + 2;
    do {
      ttputc(8);
      iVar14 = iVar14 + 1;
    } while (iVar14 != 0);
    ttflush();
    if (iVar7 != 0) {
      iVar14 = iVar13;
      if (iVar6 < iVar13) {
        iVar14 = iVar6;
      }
      iVar14 = (iVar15 - iVar14) + 2;
      do {
        eputc(' ');
        iVar14 = iVar14 + 1;
      } while (iVar14 != 0);
      ttcol = ttcol - iVar7;
      if (iVar7 != 0) {
        if (iVar6 < iVar13) {
          iVar13 = iVar6;
        }
        iVar15 = (iVar15 - iVar13) + 2;
        do {
          ttputc(8);
          iVar15 = iVar15 + 1;
        } while (iVar15 != 0);
      }
      goto LAB_0010d9dc;
    }
  }
  ttcol = ttcol - iVar7;
LAB_0010d9dc:
  *nx = local_34;
  return local_40;
}

Assistant:

static int
complt(int flags, int c, char *buf, size_t nbuf, int cpos, int *nx)
{
	struct list	*lh, *lh2;
	struct list	*wholelist = NULL;
	int	 i, nxtra, nhits, bxtra, msglen, nshown;
	int	 wflag = FALSE;
	char	*msg;

	lh = lh2 = NULL;

	if ((flags & EFFUNC) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = complete_function_list(buf);
	} else if ((flags & EFBUF) != 0) {
		lh = &(bheadp->b_list);
	} else if ((flags & EFFILE) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = make_file_list(buf);
	} else
		panic("broken complt call: flags");

	if (c == ' ')
		wflag = TRUE;
	else if (c != '\t' && c != CCHR('M'))
		panic("broken complt call: c");

	nhits = 0;
	nxtra = HUGE;

	for (; lh != NULL; lh = lh->l_next) {
		if (memcmp(buf, lh->l_name, cpos) != 0)
			continue;
		if (nhits == 0)
			lh2 = lh;
		++nhits;
		if (lh->l_name[cpos] == '\0')
			nxtra = -1; /* exact match */
		else {
			bxtra = getxtra(lh, lh2, cpos, wflag);
			if (bxtra < nxtra)
				nxtra = bxtra;
			lh2 = lh;
		}
	}
	if (nhits == 0)
		msg = " [No match]";
	else if (nhits > 1 && nxtra == 0)
		msg = " [Ambiguous. Ctrl-G to cancel]";
	else {
		/*
		 * Being lazy - ought to check length, but all things
		 * autocompleted have known types/lengths.
		 */
		if (nxtra < 0 && nhits > 1 && c == ' ')
			nxtra = 1; /* ??? */
		for (i = 0; i < nxtra && cpos < nbuf; ++i) {
			buf[cpos] = lh2->l_name[cpos];
			eputc(buf[cpos++]);
		}
		/* XXX should grow nbuf */
		ttflush();
		free_file_list(wholelist);
		*nx = nxtra;
		if (nxtra < 0 && c != CCHR('M')) /* exact */
			*nx = 0;
		return (TRUE);
	}

	/*
	 * wholelist is NULL if we are doing buffers.  Want to free lists
	 * that were created for us, but not the buffer list!
	 */
	free_file_list(wholelist);

	/* Set up backspaces, etc., being mindful of echo line limit. */
	msglen = strlen(msg);
	nshown = (ttcol + msglen + 2 > ncol) ?
		ncol - ttcol - 2 : msglen;
	eputs(msg);
	ttcol -= (i = nshown);	/* update ttcol!		 */
	while (i--)		/* move back before msg		 */
		ttputc('\b');
	ttflush();		/* display to user		 */
	i = nshown;
	while (i--)		/* blank out on next flush	 */
		eputc(' ');
	ttcol -= (i = nshown);	/* update ttcol on BS's		 */
	while (i--)
		ttputc('\b');	/* update ttcol again!		 */
	*nx = nxtra;
	return ((nhits > 0) ? TRUE : FALSE);
}